

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

TypeInfo * dap::TypeOf<std::vector<dap::Checksum,_std::allocator<dap::Checksum>_>_>::type(void)

{
  int iVar1;
  BasicTypeInfo<std::vector<dap::Checksum,_std::allocator<dap::Checksum>_>_> *pBVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (TypeOf<std::vector<dap::Checksum,std::allocator<dap::Checksum>>>::type()::typeinfo == '\0') {
    iVar1 = __cxa_guard_acquire(&TypeOf<std::vector<dap::Checksum,std::allocator<dap::Checksum>>>::
                                 type()::typeinfo);
    if (iVar1 != 0) {
      TypeOf<dap::Checksum>::type();
      (*TypeOf<dap::Checksum>::type::typeinfo.super_BasicTypeInfo<dap::Checksum>.super_TypeInfo.
        _vptr_TypeInfo[2])(&bStack_68,&TypeOf<dap::Checksum>::type::typeinfo);
      std::operator+(&local_48,"array<",&bStack_68);
      std::operator+(&local_28,&local_48,">");
      pBVar2 = TypeInfo::
               create<dap::BasicTypeInfo<std::vector<dap::Checksum,std::allocator<dap::Checksum>>>,std::__cxx11::string>
                         (&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&bStack_68);
      type::typeinfo = pBVar2;
      __cxa_guard_release(&TypeOf<std::vector<dap::Checksum,std::allocator<dap::Checksum>>>::type()
                           ::typeinfo);
    }
  }
  return &type::typeinfo->super_TypeInfo;
}

Assistant:

static inline const TypeInfo* type() {
    static auto typeinfo = TypeInfo::create<BasicTypeInfo<array<T>>>(
        "array<" + TypeOf<T>::type()->name() + ">");
    return typeinfo;
  }